

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O1

void Assimp::FBX::Util::EncodeByteBlock(char *bytes,string *out_string,size_t string_pos)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = *bytes;
  bVar2 = bytes[1];
  bVar3 = bytes[2];
  (out_string->_M_dataplus)._M_p[string_pos] =
       "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
  (out_string->_M_dataplus)._M_p[string_pos + 1] =
       "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
       [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
  (out_string->_M_dataplus)._M_p[string_pos + 2] =
       "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
       [(uint)(bVar3 >> 6) + (bVar2 & 0xf) * 4];
  (out_string->_M_dataplus)._M_p[string_pos + 3] =
       "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f];
  return;
}

Assistant:

void EncodeByteBlock(const char* bytes, std::string& out_string, size_t string_pos)
{
    char b0 = (bytes[0] & 0xFC) >> 2;
    char b1 = (bytes[0] & 0x03) << 4 | ((bytes[1] & 0xF0) >> 4);
    char b2 = (bytes[1] & 0x0F) << 2 | ((bytes[2] & 0xC0) >> 6);
    char b3 = (bytes[2] & 0x3F);

    out_string[string_pos + 0] = EncodeBase64(b0);
    out_string[string_pos + 1] = EncodeBase64(b1);
    out_string[string_pos + 2] = EncodeBase64(b2);
    out_string[string_pos + 3] = EncodeBase64(b3);
}